

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iuutil::detail::
CmpHelperEqRange<int_const*,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (AssertionResult *__return_storage_ptr__,detail *this,char *expected_expr,
          char *actual_expr,int *b1,int *e1,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> b2,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> e2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  AssertionResult ar;
  char *local_80;
  detail *local_78;
  AssertionResult local_70;
  AssertionResult local_48;
  pointer local_20;
  
  local_80 = expected_expr;
  local_78 = this;
  CmpHelperEqIterator<int_const*,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            (&local_48,(iuutil *)actual_expr,b1,e1,b2,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)e1);
  if (local_48.m_result == true) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    paVar1 = &local_70.m_message.field_2;
    local_70.m_message._M_string_length = 0;
    local_70.m_message.field_2._M_local_buf[0] = '\0';
    local_70.m_result = false;
    local_70.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar3 = iutest::AssertionResult::operator<<(&local_70,(char (*) [18])"error: Expected: ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char **)&local_78);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [5])" == ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_80);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [12])" \n  Actual:");
    local_20 = local_48.m_message._M_dataplus._M_p;
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_20);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.m_message._M_dataplus._M_p,
                      CONCAT71(local_70.m_message.field_2._M_allocated_capacity._1_7_,
                               local_70.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqRange(const char* expected_expr, const char* actual_expr
    , T1 b1, T1 e1, T2 b2, T2 e2)
{
    if( ::iutest::AssertionResult ar = CmpHelperEqIterator(b1, e1, b2, e2) )
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: " << expected_expr << " == " << actual_expr
            << " \n  Actual:" << GetAssertionResultMessage(ar);
    }
}